

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::assignDiffuseColor(XmlSerializer *this,aiMaterial *mat)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  aiColor4D diffuse;
  aiColor4D local_28;
  
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                    (this->xmlReader,XmlTag::basematerials_displaycolor_abi_cxx11_);
  local_28.r = 0.0;
  local_28.g = 0.0;
  local_28.b = 0.0;
  local_28.a = 0.0;
  bVar1 = parseColor(this,(char *)CONCAT44(extraout_var,iVar2),&local_28);
  if (bVar1) {
    aiMaterial::AddBinaryProperty(mat,&local_28,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  }
  return;
}

Assistant:

void assignDiffuseColor( aiMaterial *mat ) {
        const char *color = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_displaycolor.c_str() );
        aiColor4D diffuse;
        if ( parseColor( color, diffuse ) ) {
            mat->AddProperty<aiColor4D>( &diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        }

    }